

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

bool __thiscall IR::Instr::IsEqual(Instr *this,Instr *compareInstr)

{
  Opnd *this_00;
  Opnd *this_01;
  Opnd *this_02;
  Opnd *opnd;
  Opnd *opnd_00;
  Opnd *opnd_01;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (compareInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x9b,"(compareInstr)","compareInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if ((this->m_kind == compareInstr->m_kind) && (this->m_opcode == compareInstr->m_opcode)) {
    this_00 = this->m_dst;
    this_01 = this->m_src1;
    this_02 = this->m_src2;
    opnd = compareInstr->m_dst;
    opnd_00 = compareInstr->m_src1;
    opnd_01 = compareInstr->m_src2;
    if ((((this_00 == opnd) ||
         ((opnd != (Opnd *)0x0 && this_00 != (Opnd *)0x0 &&
          (bVar2 = Opnd::IsEqual(this_00,opnd), bVar2)))) &&
        ((this_01 == opnd_00 ||
         ((opnd_00 != (Opnd *)0x0 && this_01 != (Opnd *)0x0 &&
          (bVar2 = Opnd::IsEqual(this_01,opnd_00), bVar2)))))) &&
       ((this_02 == opnd_01 ||
        ((opnd_01 != (Opnd *)0x0 && this_02 != (Opnd *)0x0 &&
         (bVar2 = Opnd::IsEqual(this_02,opnd_01), bVar2)))))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
Instr::IsEqual(IR::Instr *compareInstr) const
{
    Assert(compareInstr);
    if (this->GetKind() == compareInstr->GetKind()
        && this->m_opcode == compareInstr->m_opcode)
    {
        IR::Opnd *dst = this->GetDst();
        IR::Opnd *src1 = this->GetSrc1();
        IR::Opnd *src2 = this->GetSrc2();
        IR::Opnd *compareDst = compareInstr->GetDst();
        IR::Opnd *compareSrc1 = compareInstr->GetSrc1();
        IR::Opnd *compareSrc2 = compareInstr->GetSrc2();

        // when both dst and compareDst are null, they are equal, same applies to src1, src2
        if ((dst != compareDst) && (!dst || !compareDst || !dst->IsEqual(compareDst)))
        {
            return false;
        }
        if ((src1 != compareSrc1) && (!src1 || !compareSrc1 || !src1->IsEqual(compareSrc1)))
        {
            return false;
        }
        if ((src2 != compareSrc2) && (!src2 || !compareSrc2 || !src2->IsEqual(compareSrc2)))
        {
            return false;
        }

        return true;
    }
    else
    {
        return false;
    }
}